

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picture_tools_enc.c
# Opt level: O3

int SmoothenBlock(uint8_t *a_ptr,int a_stride,uint8_t *y_ptr,int y_stride,int width,int height)

{
  int iVar1;
  int iVar2;
  uint8_t *luma_ptr;
  uint8_t *puVar3;
  int iVar4;
  uint8_t *alpha_ptr;
  uint8_t *puVar5;
  ulong uVar6;
  
  if (height < 1) {
    iVar2 = 0;
  }
  else {
    iVar1 = 0;
    iVar4 = 0;
    iVar2 = 0;
    puVar3 = y_ptr;
    puVar5 = a_ptr;
    do {
      if (0 < width) {
        uVar6 = 0;
        do {
          if (puVar5[uVar6] != '\0') {
            iVar2 = iVar2 + 1;
            iVar1 = iVar1 + (uint)puVar3[uVar6];
          }
          uVar6 = uVar6 + 1;
        } while ((uint)width != uVar6);
      }
      puVar5 = puVar5 + a_stride;
      puVar3 = puVar3 + y_stride;
      iVar4 = iVar4 + 1;
    } while (iVar4 != height);
    if ((0 < iVar2) && (iVar2 < height * width)) {
      iVar1 = iVar1 / iVar2;
      iVar2 = 1;
      if (0 < height) {
        iVar4 = 0;
        do {
          if (0 < width) {
            uVar6 = 0;
            do {
              if (a_ptr[uVar6] == '\0') {
                y_ptr[uVar6] = (uint8_t)iVar1;
              }
              uVar6 = uVar6 + 1;
            } while ((uint)width != uVar6);
          }
          a_ptr = a_ptr + a_stride;
          y_ptr = y_ptr + y_stride;
          iVar4 = iVar4 + 1;
        } while (iVar4 != height);
      }
    }
  }
  return (uint)(iVar2 == 0);
}

Assistant:

static int SmoothenBlock(const uint8_t* a_ptr, int a_stride, uint8_t* y_ptr,
                         int y_stride, int width, int height) {
  int sum = 0, count = 0;
  int x, y;
  const uint8_t* alpha_ptr = a_ptr;
  uint8_t* luma_ptr = y_ptr;
  for (y = 0; y < height; ++y) {
    for (x = 0; x < width; ++x) {
      if (alpha_ptr[x] != 0) {
        ++count;
        sum += luma_ptr[x];
      }
    }
    alpha_ptr += a_stride;
    luma_ptr += y_stride;
  }
  if (count > 0 && count < width * height) {
    const uint8_t avg_u8 = (uint8_t)(sum / count);
    alpha_ptr = a_ptr;
    luma_ptr = y_ptr;
    for (y = 0; y < height; ++y) {
      for (x = 0; x < width; ++x) {
        if (alpha_ptr[x] == 0) luma_ptr[x] = avg_u8;
      }
      alpha_ptr += a_stride;
      luma_ptr += y_stride;
    }
  }
  return (count == 0);
}